

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,cmCustomCommandType type,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmCustomCommand *this_00;
  bool bVar1;
  PolicyStatus cmp0116;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  cmCustomCommandLines *commandLines;
  cmTarget *pcVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  GeneratorAction local_78;
  
  outputs = cmCustomCommand::GetByproducts_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  commandLines = cmCustomCommand::GetCommandLines
                           ((cc->_M_t).
                            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar2 = GetCustomCommandTarget(this,target,Reject,&this->Backtrace);
  if (pcVar2 != (cmTarget *)0x0) {
    bVar1 = ValidateCustomCommand(this,commandLines);
    if (bVar1) {
      CreateGeneratedOutputs(this,outputs);
      this_00 = (cc->_M_t).
                super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cmp0116 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0116,false);
      cmCustomCommand::SetCMP0116Status(this_00,cmp0116);
      local_a0._M_head_impl =
           (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_98._M_unused._M_object = operator_new(0x18);
      *(cmMakefile **)local_98._M_unused._0_8_ = this;
      *(cmTarget **)((long)local_98._M_unused._0_8_ + 8) = pcVar2;
      *(cmCustomCommandType *)((long)local_98._M_unused._0_8_ + 0x10) = type;
      pcStack_80 = std::
                   _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1111:5)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx:1111:5)>
                 ::_M_manager;
      GeneratorAction::GeneratorAction
                (&local_78,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_a0,
                 (CCActionT *)&local_98);
      AddGeneratorAction(this,&local_78);
      GeneratorAction::~GeneratorAction(&local_78);
      std::_Function_base::~_Function_base((_Function_base *)&local_98);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_a0);
    }
  }
  return pcVar2;
}

Assistant:

cmTarget* cmMakefile::AddCustomCommandToTarget(
  const std::string& target, cmCustomCommandType type,
  std::unique_ptr<cmCustomCommand> cc)
{
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  cmTarget* t = this->GetCustomCommandTarget(
    target, cmObjectLibraryCommands::Reject, this->Backtrace);

  // Validate custom commands.
  if (!t || !this->ValidateCustomCommand(commandLines)) {
    return t;
  }

  // Always create the byproduct sources and mark them generated.
  this->CreateGeneratedOutputs(byproducts);

  cc->SetCMP0116Status(this->GetPolicyStatus(cmPolicies::CMP0116));

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt,
        std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      detail::AddCustomCommandToTarget(lg, cmCommandOrigin::Project, t, type,
                                       std::move(tcc));
    });

  return t;
}